

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase247::run(TestCase247 *this)

{
  void *pvVar1;
  void *__s;
  uchar *puVar2;
  Arena arena;
  Arena local_48;
  uchar *local_28;
  uchar *local_20;
  
  Arena::Arena(&local_48,0x400);
  pvVar1 = Arena::allocateBytes(&local_48,1,1,false);
  __s = Arena::allocateBytes(&local_48,0x400,1,false);
  puVar2 = (uchar *)Arena::allocateBytes(&local_48,1,1,false);
  if ((__s <= (void *)((long)pvVar1 + 0x200) && pvVar1 <= __s) && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x101,ERROR,"\"failed: expected \" \"arr.begin() < &b1 || arr.begin() > &b1 + 512\""
               ,(char (*) [62])"failed: expected arr.begin() < &b1 || arr.begin() > &b1 + 512");
  }
  if (((uchar *)((long)__s + 0x400) != puVar2) && (_::Debug::minSeverity < 3)) {
    local_28 = puVar2;
    local_20 = (uchar *)((long)__s + 0x400);
    _::Debug::log<char_const(&)[38],unsigned_char*,unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x104,ERROR,"\"failed: expected \" \"(arr.end()) == (&b2)\", arr.end(), &b2",
               (char (*) [38])"failed: expected (arr.end()) == (&b2)",&local_20,&local_28);
  }
  memset(__s,0xbe,0x400);
  Arena::~Arena(&local_48);
  return;
}

Assistant:

TEST(Arena, TooBig) {
  Arena arena(1024);

  byte& b1 = arena.allocate<byte>();

  ArrayPtr<byte> arr = arena.allocateArray<byte>(1024);

  byte& b2 = arena.allocate<byte>();

  // The array should not have been allocated anywhere near that first byte.
  EXPECT_TRUE(arr.begin() < &b1 || arr.begin() > &b1 + 512);

  // The next byte should have been allocated after the array.
  EXPECT_EQ(arr.end(), &b2);

  // Write to the array to make sure it's valid.
  memset(arr.begin(), 0xbe, arr.size());
}